

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O2

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_signature(LicenseVerifier *this,FullLicenseInfo *licInfo)

{
  LCC_EVENT_TYPE_conflict event;
  FUNCTION_RETURN FVar1;
  string licInfoData;
  
  FullLicenseInfo::printForSign_abi_cxx11_(&licInfoData,licInfo);
  FVar1 = os::verify_signature(&licInfoData,&licInfo->license_signature);
  event = IFF_LOOPBACK;
  if (FVar1 == FUNC_RET_OK) {
    event = SIGNATURE_VERIFIED;
  }
  EventRegistry::addEvent(this->m_event_registry,event,&licInfo->source);
  std::__cxx11::string::~string((string *)&licInfoData);
  return FVar1;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_signature(const FullLicenseInfo& licInfo) {
	const string licInfoData(licInfo.printForSign());

	FUNCTION_RETURN ret = license::os::verify_signature(licInfoData, licInfo.license_signature);

	if (ret == FUNC_RET_OK) {
		m_event_registry.addEvent(SIGNATURE_VERIFIED, licInfo.source);
	} else {
		m_event_registry.addEvent(LICENSE_CORRUPTED, licInfo.source);
	}
	return ret;
}